

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O2

void __thiscall
flow_cutter::UnitFlow::
increase<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
          (UnitFlow *this,
          Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
          *graph,int a)

{
  ulong uVar1;
  
  uVar1 = (ulong)((uint)((this->flow).data_.data_[a / 0x20] >>
                        ((ulong)(uint)((a % 0x20) * 2) & 0x3f)) & 3);
  TinyIntIDFunc<2>::set(&this->flow,a,uVar1 + 1);
  TinyIntIDFunc<2>::set
            (&this->flow,(((graph->back_arc).ptr)->super_ArrayIDFunc<int>).data_[a],1 - uVar1);
  return;
}

Assistant:

void increase(const Graph& graph, int a)
    {
        auto f = flow(a);
        assert((f == 0 || f == 1) && "Flow is already maximum; can not be increased");
        assert(flow(graph.back_arc(a)) == 2 - f && "Back arc has invalid flow");
        ++f;
        flow.set(a, f);
        flow.set(graph.back_arc(a), 2 - f);
    }